

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

int phyr::SampledSpectrum::init(EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  double dVar1;
  double l1_1;
  double l0_1;
  int i_1;
  double l1;
  double l0;
  int i;
  int local_1c;
  int local_4;
  
  local_4 = 0;
  while (local_4 < 0x3c) {
    lerp((double)local_4 / 60.0,400.0,700.0);
    lerp((double)(local_4 + 1) / 60.0,400.0,700.0);
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(X + (long)local_4 * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(Y + (long)local_4 * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(Z + (long)local_4 * 8) = dVar1;
    in_EAX = local_4 + 1;
    local_4 = in_EAX;
  }
  local_1c = 0;
  while (local_1c < 0x3c) {
    lerp((double)local_1c / 60.0,400.0,700.0);
    lerp((double)(local_1c + 1) / 60.0,400.0,700.0);
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbRefl2SpectWhite + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbRefl2SpectCyan + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbRefl2SpectMagenta + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbRefl2SpectYellow + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbRefl2SpectRed + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbRefl2SpectGreen + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbRefl2SpectBlue + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbIllum2SpectWhite + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbIllum2SpectCyan + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbIllum2SpectMagenta + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbIllum2SpectYellow + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbIllum2SpectRed + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbIllum2SpectGreen + (long)local_1c * 8) = dVar1;
    dVar1 = averageSampleRange((double *)l0,(double *)l1,i_1,l0_1,l1_1);
    *(double *)(rgbIllum2SpectBlue + (long)local_1c * 8) = dVar1;
    in_EAX = local_1c + 1;
    local_1c = in_EAX;
  }
  return in_EAX;
}

Assistant:

static void init() {
        // Initiate X, Y, and Z spectrums
        for (int i = 0; i < nSampleSize; i++) {
            Real l0 = lerp(Real(i) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            Real l1 = lerp(Real(i + 1) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            X.samples[i] = averageSampleRange(CIE_LAMBDA, CIE_X, nCIESamples, l0, l1);
            Y.samples[i] = averageSampleRange(CIE_LAMBDA, CIE_Y, nCIESamples, l0, l1);
            Z.samples[i] = averageSampleRange(CIE_LAMBDA, CIE_Z, nCIESamples, l0, l1);
        }

        // Initiate spectrums for RGB to XYZ conversion
        for (int i = 0; i < nSampleSize; ++i) {
            Real l0 = lerp(Real(i) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            Real l1 = lerp(Real(i + 1) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            rgbRefl2SpectWhite.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectWhite,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectCyan.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectCyan,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectMagenta.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectMagenta,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectYellow.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectYellow,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectRed.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectRed,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectGreen.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectGreen,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectBlue.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectBlue,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectWhite.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectWhite,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectCyan.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectCyan,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectMagenta.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectMagenta,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectYellow.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectYellow,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectRed.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectRed,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectGreen.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectGreen,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectBlue.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectBlue,
                                       nRGB2SpectSamples, l0, l1);
        }
    }